

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *enumNode,Reader *replacement)

{
  ListElementCount LVar1;
  int iVar2;
  CapTableReader *pCVar3;
  PointerReader local_78;
  ListReader local_58;
  
  iVar2 = 0x7fffffff;
  if ((enumNode->_reader).pointerCount < 4) {
    local_78.capTable = (CapTableReader *)0x0;
    local_78.pointer = (WirePointer *)0x0;
    local_78.segment = (SegmentReader *)0x0;
    local_78.nestingLimit = 0x7fffffff;
  }
  else {
    local_78.segment = (enumNode->_reader).segment;
    local_78.capTable = (enumNode->_reader).capTable;
    local_78.pointer = (enumNode->_reader).pointers + 3;
    local_78.nestingLimit = (enumNode->_reader).nestingLimit;
  }
  pCVar3 = (CapTableReader *)0x0;
  _::PointerReader::getList(&local_58,&local_78,INLINE_COMPOSITE,(word *)0x0);
  LVar1 = local_58.elementCount;
  local_78.pointer = (WirePointer *)0x0;
  local_78.segment = (SegmentReader *)0x0;
  if (3 < (replacement->_reader).pointerCount) {
    local_78.segment = (replacement->_reader).segment;
    pCVar3 = (replacement->_reader).capTable;
    local_78.pointer = (replacement->_reader).pointers + 3;
    iVar2 = (replacement->_reader).nestingLimit;
  }
  local_78.capTable = pCVar3;
  local_78.nestingLimit = iVar2;
  _::PointerReader::getList(&local_58,&local_78,INLINE_COMPOSITE,(word *)0x0);
  if (LVar1 < local_58.elementCount) {
    replacementIsNewer(this);
  }
  else if (local_58.elementCount < LVar1) {
    replacementIsOlder(this);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Enum::Reader& enumNode,
                          const schema::Node::Enum::Reader& replacement) {
    uint size = enumNode.getEnumerants().size();
    uint replacementSize = replacement.getEnumerants().size();
    if (replacementSize > size) {
      replacementIsNewer();
    } else if (replacementSize < size) {
      replacementIsOlder();
    }
  }